

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void InitShaders(void)

{
  uint32_t *unaff_retaddr;
  char *basicFragmentShader;
  char *basicVertexShader;
  char *in_stack_00000030;
  char *in_stack_00000038;
  uint32_t *in_stack_00000040;
  int value;
  char *name;
  
  (*glad_glEnable)(0xb71);
  name = 
  "#version 330 core\nlayout(location = 0) in vec3 position;layout(location = 1) in vec2 texCoord;out vec2 v_TexCoord;void main() {   gl_Position = vec4(position.xy, -1, 1.0);   v_TexCoord = texCoord;}"
  ;
  value = 0;
  InitShader(in_stack_00000040,in_stack_00000038,in_stack_00000030);
  BindShader((uint32_t *)0x1474bc);
  SetUniform1i(unaff_retaddr,name,value);
  UnBindShader((uint32_t *)0x1474dd);
  return;
}

Assistant:

void InitShaders() {
    glEnable(GL_DEPTH_TEST);
    const char* basicVertexShader = ""
                                    "#version 330 core"
                                    "\n"
                                    "layout(location = 0) in vec3 position;"
                                    "layout(location = 1) in vec2 texCoord;"
                                    ""
                                    "out vec2 v_TexCoord;"
                                    ""
                                    "void main() {"
                                    "   gl_Position = vec4(position.xy, -1, 1.0);"
                                    "   v_TexCoord = texCoord;"
                                    "}";

    const char* basicFragmentShader = ""
                                      "#version 330 core"
                                      "\n"
                                      "layout(location = 0) out vec4 color;"
                                      ""
                                      "in vec2 v_TexCoord;"
                                      "uniform sampler2D u_Texture;"
                                      ""
                                      "void main() {"
                                      " vec4 texColor = texture(u_Texture, v_TexCoord);"
                                      " "
                                      " color = texColor;"
                                      "}";

    InitShader(&basicShaderId, basicVertexShader, basicFragmentShader);
    BindShader(&basicShaderId);
    SetUniform1i(&basicShaderId, "u_Texture", 0);
    UnBindShader(&basicShaderId);
}